

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

OneStepDelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OneStepDelaySyntax,slang::syntax::OneStepDelaySyntax_const&>
          (BumpAllocator *this,OneStepDelaySyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  OneStepDelaySyntax *pOVar13;
  
  pOVar13 = (OneStepDelaySyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_TimingControlSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_TimingControlSyntax).super_SyntaxNode.previewNode;
  TVar5 = (args->hash).kind;
  uVar6 = (args->hash).field_0x2;
  NVar7.raw = (args->hash).numFlags.raw;
  uVar8 = (args->hash).rawLen;
  pIVar3 = (args->hash).info;
  TVar9 = (args->oneStep).kind;
  uVar10 = (args->oneStep).field_0x2;
  NVar11.raw = (args->oneStep).numFlags.raw;
  uVar12 = (args->oneStep).rawLen;
  (pOVar13->super_TimingControlSyntax).super_SyntaxNode.kind =
       (args->super_TimingControlSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pOVar13->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pOVar13->super_TimingControlSyntax).super_SyntaxNode.parent = pSVar1;
  (pOVar13->super_TimingControlSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pOVar13->hash).kind = TVar5;
  (pOVar13->hash).field_0x2 = uVar6;
  (pOVar13->hash).numFlags = (NumericTokenFlags)NVar7.raw;
  (pOVar13->hash).rawLen = uVar8;
  (pOVar13->hash).info = pIVar3;
  (pOVar13->oneStep).kind = TVar9;
  (pOVar13->oneStep).field_0x2 = uVar10;
  (pOVar13->oneStep).numFlags = (NumericTokenFlags)NVar11.raw;
  (pOVar13->oneStep).rawLen = uVar12;
  (pOVar13->oneStep).info = (args->oneStep).info;
  return pOVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }